

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::java::JavaGenerator::Generate
          (JavaGenerator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  _Alloc_hider _Var1;
  pointer puVar2;
  pointer ppVar3;
  bool bVar4;
  int iVar5;
  FileGenerator *pFVar6;
  ZeroCopyOutputStream *pZVar7;
  ZeroCopyOutputStream *output;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  AnnotationCollector *annotation_collector_00;
  pointer puVar8;
  long lVar9;
  string *psVar10;
  AlphaNum *c;
  byte bVar11;
  char *unaff_R12;
  unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
  *file_generator;
  unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
  *puVar12;
  unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
  *puVar13;
  ulong uVar14;
  pointer ppVar15;
  string_view text;
  string_view text_00;
  string_view text_01;
  vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
  file_generators;
  Options file_options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_annotations;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_files;
  string java_filename;
  string package_dir;
  string info_full_path;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  Printer printer;
  GeneratedCodeInfo annotations;
  vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
  local_308;
  undefined1 local_2e8 [8];
  _Alloc_hider local_2e0;
  size_type local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  _Alloc_hider local_2c0;
  size_type local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  undefined2 local_2a0;
  undefined1 local_298 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  char *local_260;
  string local_258;
  string local_238;
  string local_218;
  undefined1 local_1f8 [48];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  AnnotationCollector local_1a8;
  AlphaNum *local_1a0;
  Printer local_198;
  AlphaNum local_60;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  local_1c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  text._M_str = (char *)&local_1c8;
  text._M_len = (size_t)(parameter->_M_dataplus)._M_p;
  c = (AlphaNum *)error;
  ParseGeneratorParameter
            ((compiler *)parameter->_M_string_length,text,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)context);
  ppVar3 = local_1c8.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_2e8[0] = false;
  local_2e8[1] = false;
  local_2e8[2] = false;
  local_2e8[3] = false;
  local_2e0._M_p = (pointer)&local_2d0;
  local_2d8 = 0;
  local_2d0._M_local_buf[0] = '\0';
  local_2c0._M_p = (pointer)&local_2b0;
  local_2b8 = 0;
  local_2b0._M_local_buf[0] = '\0';
  local_2a0._0_1_ = false;
  local_2a0._1_1_ = true;
  local_2e8[5] = 0;
  local_2e8[4] = this->opensource_runtime_;
  if (local_1c8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1c8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    unaff_R12 = "output_list_file";
    ppVar15 = local_1c8.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar5 = std::__cxx11::string::compare((char *)ppVar15);
      psVar10 = (string *)&local_2c0;
      if (iVar5 == 0) {
LAB_00e26397:
        std::__cxx11::string::_M_assign(psVar10);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)ppVar15);
        if (iVar5 == 0) {
          local_2e8[0] = true;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)ppVar15);
          if (iVar5 == 0) {
            local_2e8[1] = true;
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)ppVar15);
            if (iVar5 == 0) {
              local_2e8[2] = true;
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)ppVar15);
              if (iVar5 == 0) {
                local_2e8[3] = true;
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)ppVar15);
                if (iVar5 == 0) {
                  local_2e8[5] = 1;
                }
                else {
                  iVar5 = std::__cxx11::string::compare((char *)ppVar15);
                  psVar10 = (string *)&local_2e0;
                  if (iVar5 == 0) goto LAB_00e26397;
                  iVar5 = std::__cxx11::string::compare((char *)ppVar15);
                  if (iVar5 != 0) {
                    local_198.sink_.stream_ = (ZeroCopyOutputStream *)0x1a;
                    local_198.sink_.buffer_ = "Unknown generator option: ";
                    local_60.piece_._M_str = (ppVar15->first)._M_dataplus._M_p;
                    local_60.piece_._M_len = (ppVar15->first)._M_string_length;
                    absl::lts_20250127::StrCat_abi_cxx11_
                              ((string *)local_1f8,(lts_20250127 *)&local_198,&local_60,
                               (AlphaNum *)local_60.piece_._M_len);
                    std::__cxx11::string::operator=((string *)error,(string *)local_1f8);
                    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    bVar11 = 0;
                    goto LAB_00e26b38;
                  }
                  local_2a0._0_1_ = true;
                }
              }
            }
          }
        }
      }
      ppVar15 = ppVar15 + 1;
    } while (ppVar15 != ppVar3);
  }
  bVar4 = (bool)local_2e8[3];
  if (((bool)local_2e8[3] == true) && ((bool)local_2e8[1] == true)) {
    bVar11 = 0;
    std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x133d7b4);
  }
  else {
    if (((bool)local_2e8[0] == false) &&
       (((bool)local_2e8[1] == false && ((bool)local_2e8[2] == false)))) {
      local_2e8[0] = true;
      local_2e8[2] = true;
      local_2e8._0_4_ = CONCAT13(bVar4,local_2e8._0_3_);
    }
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_298._16_8_ = (pointer)0x0;
    local_298._0_8_ = (pointer)0x0;
    local_298._8_8_ = (pointer)0x0;
    local_308.
    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.
    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
          *)0x0;
    local_308.
    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
          *)0x0;
    if ((bool)local_2e8[0] == true) {
      pFVar6 = (FileGenerator *)operator_new(0xe8);
      FileGenerator::FileGenerator(pFVar6,file,(Options *)local_2e8,true);
      local_198.sink_.stream_ = (ZeroCopyOutputStream *)pFVar6;
      std::
      vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>>
      ::
      emplace_back<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>
                ((vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>>
                  *)&local_308,
                 (unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                  *)&local_198);
      std::
      unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
      ::~unique_ptr((unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                     *)&local_198);
    }
    puVar12 = local_308.
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar13 = local_308.
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((bool)local_2e8[1] == true) {
      pFVar6 = (FileGenerator *)operator_new(0xe8);
      FileGenerator::FileGenerator(pFVar6,file,(Options *)local_2e8,false);
      local_198.sink_.stream_ = (ZeroCopyOutputStream *)pFVar6;
      std::
      vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>>
      ::
      emplace_back<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>
                ((vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>>
                  *)&local_308,
                 (unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                  *)&local_198);
      std::
      unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
      ::~unique_ptr((unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                     *)&local_198);
      puVar12 = local_308.
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar13 = local_308.
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; puVar2 = local_308.
                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        unaff_R12 = (char *)CONCAT71((int7)((ulong)unaff_R12 >> 8),puVar12 == puVar13),
        puVar12 != puVar13; puVar12 = puVar12 + 1) {
      bVar4 = FileGenerator::Validate
                        ((puVar12->_M_t).
                         super___uniq_ptr_impl<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::compiler::java::FileGenerator_*,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                         .
                         super__Head_base<0UL,_google::protobuf::compiler::java::FileGenerator_*,_false>
                         ._M_head_impl,error);
      if (!bVar4) goto LAB_00e26b14;
    }
    local_260 = unaff_R12;
    if (local_308.
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_308.
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      puVar8 = local_308.
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pFVar6 = (puVar8->_M_t).
                 super___uniq_ptr_impl<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::FileGenerator_*,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::java::FileGenerator_*,_false>.
                 _M_head_impl;
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        _Var1._M_p = (pFVar6->java_package_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,_Var1._M_p,
                   _Var1._M_p + (pFVar6->java_package_)._M_string_length);
        JavaPackageToDir(&local_218,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        local_198.sink_.stream_ = (ZeroCopyOutputStream *)local_218._M_string_length;
        local_198.sink_.buffer_ = local_218._M_dataplus._M_p;
        pFVar6 = (puVar8->_M_t).
                 super___uniq_ptr_impl<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::FileGenerator_*,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::java::FileGenerator_*,_false>.
                 _M_head_impl;
        local_60.piece_._M_str = (pFVar6->classname_)._M_dataplus._M_p;
        local_60.piece_._M_len = (pFVar6->classname_)._M_string_length;
        local_1f8._0_8_ = &DAT_00000005;
        local_1f8._8_8_ = ".java";
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_258,(lts_20250127 *)&local_198,&local_60,(AlphaNum *)local_1f8,c);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_278,&local_258);
        local_198.sink_.stream_ = (ZeroCopyOutputStream *)local_258._M_string_length;
        local_198.sink_.buffer_ = local_258._M_dataplus._M_p;
        local_60.piece_._M_len = (size_t)&DAT_00000008;
        local_60.piece_._M_str = ".pb.meta";
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)local_1f8,(lts_20250127 *)&local_198,&local_60,
                   (AlphaNum *)local_258._M_string_length);
        if ((bool)local_2e8[5] == true) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_298,(value_type *)local_1f8);
        }
        iVar5 = (*context->_vptr_GeneratorContext[2])();
        pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar5);
        GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)&local_60,(Arena *)0x0);
        local_1a8._vptr_AnnotationCollector = (_func_int **)&PTR__AnnotationCollector_01956fd8;
        annotation_collector_00 = (AnnotationCollector *)0x0;
        if ((bool)local_2e8[5] != false) {
          annotation_collector_00 = &local_1a8;
        }
        local_1a0 = &local_60;
        io::Printer::Printer(&local_198,pZVar7,'$',annotation_collector_00);
        FileGenerator::Generate
                  ((puVar8->_M_t).
                   super___uniq_ptr_impl<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::FileGenerator_*,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                   .super__Head_base<0UL,_google::protobuf::compiler::java::FileGenerator_*,_false>.
                   _M_head_impl,&local_198);
        c = (AlphaNum *)local_298;
        FileGenerator::GenerateSiblings
                  ((puVar8->_M_t).
                   super___uniq_ptr_impl<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::FileGenerator_*,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                   .super__Head_base<0UL,_google::protobuf::compiler::java::FileGenerator_*,_false>.
                   _M_head_impl,&local_218,context,&local_278,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)c);
        if ((bool)local_2e8[5] == true) {
          iVar5 = (*context->_vptr_GeneratorContext[2])(context,(AlphaNum *)local_1f8);
          output = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar5);
          MessageLite::SerializeToZeroCopyStream((MessageLite *)&local_60,output);
          if (output != (ZeroCopyOutputStream *)0x0) {
            (*output->_vptr_ZeroCopyOutputStream[1])(output);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_198.line_start_variables_);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
        ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                         *)&local_198.substitutions_);
        (*local_198.substitution_listener_.
          super_Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
          .
          super_CoreImpl<false,_void,_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation>
          .manager_)(dispose,(TypeErasedState *)&local_198.substitution_listener_,
                     (TypeErasedState *)&local_198.substitution_listener_);
        std::
        vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
        ::~vector(&local_198.annotation_lookups_);
        std::
        vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
        ::~vector(&local_198.var_lookups_);
        if (local_198.paren_depth_to_omit_.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_198.paren_depth_to_omit_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_198.paren_depth_to_omit_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_198.paren_depth_to_omit_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_198.sink_.buffer_size_ != 0) {
          (*(code *)((FileDescriptor *)(local_198.sink_.stream_)->_vptr_ZeroCopyOutputStream)->pool_
          )();
        }
        GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)&local_60);
        if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
        }
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        puVar8 = puVar8 + 1;
      } while (puVar8 != puVar2);
    }
    puVar8 = local_308.
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar2 = local_308.
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar13 = local_308.
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_308.
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_308.
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        std::
        unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
        ::~unique_ptr(puVar13);
        puVar13 = puVar13 + 1;
      } while (puVar13 != puVar8);
      local_308.
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar2;
    }
    if (local_2b8 != 0) {
      iVar5 = (*context->_vptr_GeneratorContext[2])(context,&local_2c0);
      pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar5);
      io::Printer::Printer(&local_198,pZVar7,'$',(AnnotationCollector *)0x0);
      if (local_278.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_278.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar9 = 0;
        uVar14 = 0;
        do {
          text_00._M_str = "$filename$\n";
          text_00._M_len = 0xb;
          io::Printer::Print<char[9],std::__cxx11::string>
                    (&local_198,text_00,(char (*) [9])"filename",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((local_278.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9
                     ));
          uVar14 = uVar14 + 1;
          lVar9 = lVar9 + 0x20;
        } while (uVar14 < (ulong)((long)local_278.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_278.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_198.line_start_variables_);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
      ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                       *)&local_198.substitutions_);
      (*local_198.substitution_listener_.
        super_Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
        .
        super_CoreImpl<false,_void,_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation>
        .manager_)(dispose,(TypeErasedState *)&local_198.substitution_listener_,
                   (TypeErasedState *)&local_198.substitution_listener_);
      std::
      vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
      ::~vector(&local_198.annotation_lookups_);
      std::
      vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
      ::~vector(&local_198.var_lookups_);
      if (local_198.paren_depth_to_omit_.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_198.paren_depth_to_omit_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_198.paren_depth_to_omit_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_198.paren_depth_to_omit_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_198.sink_.buffer_size_ != 0) {
        (*(code *)((FileDescriptor *)(local_198.sink_.stream_)->_vptr_ZeroCopyOutputStream)->pool_)
                  ();
      }
      if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
      }
    }
    unaff_R12 = local_260;
    if (local_2d8 != 0) {
      iVar5 = (*context->_vptr_GeneratorContext[2])(context,&local_2e0);
      pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar5);
      io::Printer::Printer(&local_198,pZVar7,'$',(AnnotationCollector *)0x0);
      if (local_298._8_8_ != local_298._0_8_) {
        lVar9 = 0;
        uVar14 = 0;
        do {
          text_01._M_str = "$filename$\n";
          text_01._M_len = 0xb;
          io::Printer::Print<char[9],std::__cxx11::string>
                    (&local_198,text_01,(char (*) [9])"filename",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((_Alloc_hider *)local_298._0_8_)->_M_p + lVar9));
          uVar14 = uVar14 + 1;
          lVar9 = lVar9 + 0x20;
        } while (uVar14 < (ulong)((long)(local_298._8_8_ - local_298._0_8_) >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_198.line_start_variables_);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
      ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                       *)&local_198.substitutions_);
      (*local_198.substitution_listener_.
        super_Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
        .
        super_CoreImpl<false,_void,_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation>
        .manager_)(dispose,(TypeErasedState *)&local_198.substitution_listener_,
                   (TypeErasedState *)&local_198.substitution_listener_);
      std::
      vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
      ::~vector(&local_198.annotation_lookups_);
      std::
      vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
      ::~vector(&local_198.var_lookups_);
      if (local_198.paren_depth_to_omit_.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_198.paren_depth_to_omit_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_198.paren_depth_to_omit_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_198.paren_depth_to_omit_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      unaff_R12 = local_260;
      if (local_198.sink_.buffer_size_ != 0) {
        (*(code *)((FileDescriptor *)(local_198.sink_.stream_)->_vptr_ZeroCopyOutputStream)->pool_)
                  ();
      }
      if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
      }
    }
LAB_00e26b14:
    bVar11 = (byte)unaff_R12;
    std::
    vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
    ::~vector(&local_308);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_298);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_278);
  }
LAB_00e26b38:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_p != &local_2b0) {
    operator_delete(local_2c0._M_p,
                    CONCAT71(local_2b0._M_allocated_capacity._1_7_,local_2b0._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_p != &local_2d0) {
    operator_delete(local_2e0._M_p,
                    CONCAT71(local_2d0._M_allocated_capacity._1_7_,local_2d0._M_local_buf[0]) + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_1c8);
  return (bool)(bVar11 & 1);
}

Assistant:

bool JavaGenerator::Generate(const FileDescriptor* file,
                             const std::string& parameter,
                             GeneratorContext* context,
                             std::string* error) const {
  // -----------------------------------------------------------------
  // parse generator options

  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);
  Options file_options;

  file_options.opensource_runtime = opensource_runtime_;

  for (auto& option : options) {
    if (option.first == "output_list_file") {
      file_options.output_list_file = option.second;
    } else if (option.first == "immutable") {
      file_options.generate_immutable_code = true;
    } else if (option.first == "mutable") {
      file_options.generate_mutable_code = true;
    } else if (option.first == "shared") {
      file_options.generate_shared_code = true;
    } else if (option.first == "lite") {
      // Note: Java Lite does not guarantee API/ABI stability. We may choose to
      // break existing API in order to boost performance / reduce code size.
      file_options.enforce_lite = true;
    } else if (option.first == "annotate_code") {
      file_options.annotate_code = true;
    } else if (option.first == "annotation_list_file") {
      file_options.annotation_list_file = option.second;
    } else if (option.first == "experimental_strip_nonfunctional_codegen") {
      file_options.strip_nonfunctional_codegen = true;
    } else {
      *error = absl::StrCat("Unknown generator option: ", option.first);
      return false;
    }
  }

  if (file_options.enforce_lite && file_options.generate_mutable_code) {
    *error = "lite runtime generator option cannot be used with mutable API.";
    return false;
  }

  // By default we generate immutable code and shared code for immutable API.
  if (!file_options.generate_immutable_code &&
      !file_options.generate_mutable_code &&
      !file_options.generate_shared_code) {
    file_options.generate_immutable_code = true;
    file_options.generate_shared_code = true;
  }

  // -----------------------------------------------------------------


  std::vector<std::string> all_files;
  std::vector<std::string> all_annotations;


  std::vector<std::unique_ptr<FileGenerator>> file_generators;
  if (file_options.generate_immutable_code) {
    file_generators.emplace_back(
        std::make_unique<FileGenerator>(file, file_options,
                                        /* immutable = */ true));
  }
  if (file_options.generate_mutable_code) {
    file_generators.emplace_back(
        std::make_unique<FileGenerator>(file, file_options,
                                        /* mutable = */ false));
  }

  for (auto& file_generator : file_generators) {
    if (!file_generator->Validate(error)) {
      return false;
    }
  }

  for (auto& file_generator : file_generators) {
    std::string package_dir = JavaPackageToDir(file_generator->java_package());

    std::string java_filename =
        absl::StrCat(package_dir, file_generator->classname(), ".java");
    all_files.push_back(java_filename);
    std::string info_full_path = absl::StrCat(java_filename, ".pb.meta");
    if (file_options.annotate_code) {
      all_annotations.push_back(info_full_path);
    }

    // Generate main java file.
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        context->Open(java_filename));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    io::Printer printer(
        output.get(), '$',
        file_options.annotate_code ? &annotation_collector : nullptr);

    file_generator->Generate(&printer);

    // Generate sibling files.
    file_generator->GenerateSiblings(package_dir, context, &all_files,
                                     &all_annotations);

    if (file_options.annotate_code) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          context->Open(info_full_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }


  file_generators.clear();

  // Generate output list if requested.
  if (!file_options.output_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .java files being generated.
    std::unique_ptr<io::ZeroCopyOutputStream> srclist_raw_output(
        context->Open(file_options.output_list_file));
    io::Printer srclist_printer(srclist_raw_output.get(), '$');
    for (int i = 0; i < all_files.size(); i++) {
      srclist_printer.Print("$filename$\n", "filename", all_files[i]);
    }
  }

  if (!file_options.annotation_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .java files being generated.
    std::unique_ptr<io::ZeroCopyOutputStream> annotation_list_raw_output(
        context->Open(file_options.annotation_list_file));
    io::Printer annotation_list_printer(annotation_list_raw_output.get(), '$');
    for (int i = 0; i < all_annotations.size(); i++) {
      annotation_list_printer.Print("$filename$\n", "filename",
                                    all_annotations[i]);
    }
  }

  return true;
}